

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_filter.c
# Opt level: O0

int gdImageColor(gdImagePtr src,int red,int green,int blue,int alpha)

{
  uint uVar1;
  code *pcVar2;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  uint local_5c;
  int local_58;
  int local_54;
  int a;
  int b;
  int g;
  int r;
  FuncPtr f;
  int pxl;
  int new_pxl;
  int y;
  int x;
  int alpha_local;
  int blue_local;
  int green_local;
  int red_local;
  gdImagePtr src_local;
  
  if (src == (gdImagePtr)0x0) {
    src_local._4_4_ = 0;
  }
  else {
    pcVar2 = gdImageGetPixel;
    if (src->trueColor != 0) {
      pcVar2 = gdImageGetTrueColorPixel;
    }
    for (pxl = 0; pxl < src->sy; pxl = pxl + 1) {
      for (new_pxl = 0; new_pxl < src->sx; new_pxl = new_pxl + 1) {
        uVar1 = (*pcVar2)(src,new_pxl,pxl);
        if (src->trueColor == 0) {
          local_54 = src->red[(int)uVar1];
        }
        else {
          local_54 = (int)(uVar1 & 0xff0000) >> 0x10;
        }
        if (src->trueColor == 0) {
          local_58 = src->green[(int)uVar1];
        }
        else {
          local_58 = (int)(uVar1 & 0xff00) >> 8;
        }
        if (src->trueColor == 0) {
          local_5c = src->blue[(int)uVar1];
        }
        else {
          local_5c = uVar1 & 0xff;
        }
        if (src->trueColor == 0) {
          local_60 = src->alpha[(int)uVar1];
        }
        else {
          local_60 = (int)(uVar1 & 0x7f000000) >> 0x18;
        }
        local_68 = local_54 + red;
        local_70 = local_58 + green;
        local_78 = local_5c + blue;
        local_80 = local_60 + alpha;
        if (local_68 < 0x100) {
          if (local_68 < 0) {
            local_68 = 0;
          }
          local_64 = local_68;
        }
        else {
          local_64 = 0xff;
        }
        if (local_70 < 0x100) {
          if (local_70 < 0) {
            local_70 = 0;
          }
          local_6c = local_70;
        }
        else {
          local_6c = 0xff;
        }
        if (local_78 < 0x100) {
          if (local_78 < 0) {
            local_78 = 0;
          }
          local_74 = local_78;
        }
        else {
          local_74 = 0xff;
        }
        if (local_80 < 0x80) {
          if (local_80 < 0) {
            local_80 = 0;
          }
          local_7c = local_80;
        }
        else {
          local_7c = 0x7f;
        }
        f._4_4_ = gdImageColorAllocateAlpha(src,local_64,local_6c,local_74,local_7c);
        if (f._4_4_ == -1) {
          f._4_4_ = gdImageColorClosestAlpha(src,local_64,local_6c,local_74,local_7c);
        }
        gdImageSetPixel(src,new_pxl,pxl,f._4_4_);
      }
    }
    src_local._4_4_ = 1;
  }
  return src_local._4_4_;
}

Assistant:

BGD_DECLARE(int) gdImageColor(gdImagePtr src, const int red, const int green, const int blue, const int alpha)
{
	int x, y;
	int new_pxl, pxl;
	FuncPtr f;

	if (src == NULL) {
		return 0;
	}

	f = GET_PIXEL_FUNCTION(src);

	for (y=0; y<src->sy; ++y) {
		for (x=0; x<src->sx; ++x) {
			int r,g,b,a;

			pxl = f(src, x, y);
			r = gdImageRed(src, pxl);
			g = gdImageGreen(src, pxl);
			b = gdImageBlue(src, pxl);
			a = gdImageAlpha(src, pxl);

			r = r + red;
			g = g + green;
			b = b + blue;
			a = a + alpha;

			r = (r > 255)? 255 : ((r < 0)? 0 : r);
			g = (g > 255)? 255 : ((g < 0)? 0 : g);
			b = (b > 255)? 255 : ((b < 0)? 0 : b);
			a = (a > 127)? 127 : ((a < 0)? 0 : a);

			new_pxl = gdImageColorAllocateAlpha(src, r, g, b, a);
			if (new_pxl == -1) {
				new_pxl = gdImageColorClosestAlpha(src, r, g, b, a);
			}
			gdImageSetPixel (src, x, y, new_pxl);
		}
	}
	return 1;
}